

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void pstack::print_container<std::vector<int,std::allocator<int>>,char_const&>
               (ostream *os,long *container,char *ctx)

{
  int *piVar1;
  ostream *os_00;
  char *pcVar2;
  int *field;
  int *piVar3;
  JSON<int,_char> local_40;
  
  std::operator<<(os,"[ ");
  piVar1 = (int *)container[1];
  pcVar2 = "";
  for (piVar3 = (int *)*container; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    os_00 = std::operator<<(os,pcVar2);
    local_40.object = piVar3;
    local_40.context = ctx;
    operator<<(os_00,&local_40);
    pcVar2 = ",\n";
  }
  std::operator<<(os," ]");
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}